

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgtknjj(fitsfile *fptr,int numkey,char *name,LONGLONG *value,int *status)

{
  int iVar1;
  long *in_RCX;
  char *in_RDX;
  uint in_ESI;
  int *in_R8;
  char message [81];
  char comm [73];
  char valuestring [71];
  char keyname [75];
  char acStack_188 [96];
  int *in_stack_fffffffffffffed8;
  LONGLONG *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  undefined1 local_d8 [24];
  int *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  fitsfile *in_stack_ffffffffffffff68;
  char local_88 [88];
  int *local_30;
  long *local_28;
  char *local_20;
  uint local_14;
  int local_4;
  
  if (*in_R8 < 1) {
    local_88[0] = '\0';
    local_d8[0] = 0;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    iVar1 = ffgkyn(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,
                   in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    if (iVar1 < 1) {
      iVar1 = strcmp(local_88,local_20);
      if (iVar1 == 0) {
        ffc2jj(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        if ((0 < *local_30) || (*local_28 < 0)) {
          *local_30 = 0xd1;
        }
      }
      else {
        *local_30 = 0xd0;
      }
      if (0 < *local_30) {
        snprintf(acStack_188,0x51,"ffgtknjj found unexpected keyword or value for keyword no. %d.",
                 (ulong)local_14);
        ffpmsg((char *)0x1c3c6f);
        snprintf(acStack_188,0x51," Expected positive integer keyword %s, but instead",local_20);
        ffpmsg((char *)0x1c3c95);
        snprintf(acStack_188,0x51," found keyword %s with value %s",local_88,local_d8);
        ffpmsg((char *)0x1c3cc3);
      }
    }
    local_4 = *local_30;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffgtknjj(fitsfile *fptr,  /* I - FITS file pointer              */
           int numkey,      /* I - number of the keyword to read  */
           char *name,      /* I - expected name of the keyword   */
           LONGLONG *value, /* O - integer value of the keyword   */
           int *status)     /* IO - error status                  */
{
/*
  test that keyword number NUMKEY has the expected name and get the
  integer value of the keyword.  Return an error if the keyword
  name does not match the input name, or if the value of the
  keyword is not a positive integer.
*/
    char keyname[FLEN_KEYWORD], valuestring[FLEN_VALUE];
    char comm[FLEN_COMMENT], message[FLEN_ERRMSG];
   
    if (*status > 0)
        return(*status);
    
    keyname[0] = '\0';
    valuestring[0] = '\0';

    if (ffgkyn(fptr, numkey, keyname, valuestring, comm, status) <= 0)
    {
        if (strcmp(keyname, name) )
            *status = BAD_ORDER;  /* incorrect keyword name */

        else
        {
            ffc2jj(valuestring, value, status);  /* convert to integer */

            if (*status > 0 || *value < 0 )
               *status = NOT_POS_INT;
        }

        if (*status > 0)
        {
            snprintf(message, FLEN_ERRMSG,
              "ffgtknjj found unexpected keyword or value for keyword no. %d.",
              numkey);
            ffpmsg(message);

            snprintf(message, FLEN_ERRMSG,
              " Expected positive integer keyword %s, but instead", name);
            ffpmsg(message);

            snprintf(message, FLEN_ERRMSG,
              " found keyword %s with value %s", keyname, valuestring);
            ffpmsg(message);
        }
    }

    return(*status);
}